

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.h
# Opt level: O2

void lumeview::MessageQueue::
     post<lumeview::SubsetInfoAnnexMessage,lume::SubsetInfoAnnex*&,unsigned_int&,bool,bool>
               (SubsetInfoAnnex **args,uint *args_1,bool *args_2,bool *args_3)

{
  SubsetInfoAnnex *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<const_lumeview::Message> local_28;
  
  std::make_shared<lumeview::SubsetInfoAnnexMessage,lume::SubsetInfoAnnex*&,unsigned_int&,bool,bool>
            (&local_38,(uint *)args,(bool *)args_1,args_2);
  local_28.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_38;
  local_28.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_30._M_pi;
  local_38 = (SubsetInfoAnnex *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  post(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<const_lumeview::Message,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  return;
}

Assistant:

static void post (TArgs&&... args)
	{
		post (std::make_shared <TMsg> (std::forward<TArgs>(args)...));
	}